

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O3

void Am_Set_Data_From_Object(Am_Object *obj,Am_Inter_Location *data,bool growing)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  undefined7 in_register_00000011;
  Am_Object *this;
  bool as_line;
  Am_Object ref_obj;
  Am_Object local_60;
  undefined4 local_54;
  Am_Value value;
  Am_Object local_40;
  Am_Object local_38;
  
  local_54 = (undefined4)CONCAT71(in_register_00000011,growing);
  ref_obj.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Get_Object(&local_60,(Am_Slot_Key)obj,10);
  Am_Object::operator=(&ref_obj,&local_60);
  Am_Object::~Am_Object(&local_60);
  pAVar6 = Am_Object::Get(obj,0xdb,1);
  Am_Value::operator=(&value,pAVar6);
  bVar1 = Am_Value::Valid(&value);
  if (bVar1) {
    Am_Inter_Location::Get_As_Line(data,&as_line);
    if ((as_line & 1U) != 0) {
      this = &local_38;
      Am_Object::Am_Object(this,&ref_obj);
      pAVar6 = Am_Object::Get(obj,0x8b,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(obj,0x8c,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(obj,0x8d,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(obj,0x8e,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar6);
      Am_Inter_Location::Set_Location(data,true,this,iVar2,iVar3,iVar4,iVar5,false);
      goto LAB_001b9eb0;
    }
  }
  else {
    as_line = false;
  }
  this = &local_40;
  Am_Object::Am_Object(this,&ref_obj);
  pAVar6 = Am_Object::Get(obj,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(obj,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(obj,0x66,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(obj,0x67,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  Am_Inter_Location::Set_Location(data,false,this,iVar2,iVar3,iVar4,iVar5,false);
LAB_001b9eb0:
  Am_Object::~Am_Object(this);
  Am_Inter_Location::Set_Growing(data,local_54._0_1_,true);
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&ref_obj);
  return;
}

Assistant:

void
Am_Set_Data_From_Object(Am_Object obj, Am_Inter_Location data, bool growing)
{
  Am_Object ref_obj;
  bool as_line;
  Am_Value value;
  ref_obj = obj.Get_Owner();
  value = obj.Peek(Am_AS_LINE);
  if (!value.Valid())
    as_line = false;
  else
    data.Get_As_Line(as_line);
  if (as_line) {
    data.Set_Location(true, ref_obj, (int)obj.Get(Am_X1), (int)obj.Get(Am_Y1),
                      (int)obj.Get(Am_X2), (int)obj.Get(Am_Y2), false);
  } else { // not a line growing (lines move like non-lines)
    data.Set_Location(false, ref_obj, (int)obj.Get(Am_LEFT),
                      (int)obj.Get(Am_TOP), (int)obj.Get(Am_WIDTH),
                      (int)obj.Get(Am_HEIGHT), false);
  }
  data.Set_Growing(growing);
}